

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::Socket_testFailOpen_Test::TestBody(Socket_testFailOpen_Test *this)

{
  bool bVar1;
  byte bVar2;
  AssertHelper local_58 [8];
  Message local_50 [16];
  system_error *anon_var_0;
  byte local_35;
  bool gtest_caught_expected;
  ConstCharPtr local_28;
  ConstCharPtr gtest_msg;
  Socket socket;
  Socket_testFailOpen_Test *this_local;
  
  Socket::Socket((Socket *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_28,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_28);
  if (bVar1) {
    local_35 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      Socket::open((Socket *)&gtest_msg,(char *)0xfffffffb,-10);
    }
    if ((local_35 & 1) != 0) {
      anon_var_0._4_4_ = 0;
      goto LAB_002bc86a;
    }
    local_28.value =
         "Expected: socket.open(-5, -10) throws an exception of type std::system_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_50);
  testing::internal::AssertHelper::AssertHelper
            (local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x1e,local_28.value);
  testing::internal::AssertHelper::operator=(local_58,local_50);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  testing::Message::~Message(local_50);
  anon_var_0._4_4_ = 1;
LAB_002bc86a:
  Socket::~Socket((Socket *)&gtest_msg);
  return;
}

Assistant:

TEST(Socket, testFailOpen)
{
    Socket socket;
    ASSERT_THROW(socket.open(-5, -10), std::system_error);
}